

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IsReadOnly(Parse *pParse,Table *pTab,int viewOk)

{
  sqlite3 *psVar1;
  VTable *pVVar2;
  char *zFormat;
  uint uVar3;
  bool bVar4;
  
  if (pTab->nModuleArg != 0) {
    pVVar2 = pTab->pVTable;
    if (pVVar2 != (VTable *)0x0) {
      do {
        if (pVVar2->db == pParse->db) break;
        pVVar2 = pVVar2->pNext;
      } while (pVVar2 != (VTable *)0x0);
    }
    bVar4 = pVVar2->pMod->pModule->xUpdate ==
            (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0;
    goto LAB_001b4244;
  }
  if ((pTab->tabFlags & 0x401) != 0) {
    psVar1 = pParse->db;
    uVar3 = (uint)psVar1->flags;
    if ((pTab->tabFlags & 1) == 0) {
      if (((uVar3 >> 0x1c & 1) != 0) && (psVar1->pVtabCtx == (VtabCtx *)0x0)) {
        bVar4 = psVar1->nVdbeExec == 0;
LAB_001b4244:
        if (bVar4) {
          zFormat = "table %s may not be modified";
          goto LAB_001b42a6;
        }
      }
    }
    else if ((uVar3 & 0x10000001) != 1) {
      bVar4 = pParse->nested == '\0';
      goto LAB_001b4244;
    }
  }
  if (viewOk != 0) {
    return 0;
  }
  if (pTab->pSelect == (Select *)0x0) {
    return 0;
  }
  zFormat = "cannot modify %s because it is a view";
LAB_001b42a6:
  sqlite3ErrorMsg(pParse,zFormat,pTab->zName);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsReadOnly(Parse *pParse, Table *pTab, int viewOk){
  if( tabIsReadOnly(pParse, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be modified", pTab->zName);
    return 1;
  }
#ifndef SQLITE_OMIT_VIEW
  if( !viewOk && pTab->pSelect ){
    sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
    return 1;
  }
#endif
  return 0;
}